

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_memory_error.h
# Opt level: O0

double __thiscall nodecpp::error::memory_error_domain::log(memory_error_domain *this,double __x)

{
  bool bVar1;
  char *pcVar2;
  LogLevel in_EDX;
  long in_RSI;
  double __x_00;
  double dVar3;
  double extraout_XMM0_Qa;
  string_ref local_50 [2];
  string_ref local_30;
  LogLevel local_1c;
  long lStack_18;
  LogLevel l_local;
  error_value *value_local;
  memory_error_domain *this_local;
  
  local_1c = in_EDX;
  lStack_18 = in_RSI;
  value_local = (error_value *)this;
  bVar1 = impl::isDataStackInfo((StackInfo *)(in_RSI + 8));
  if (bVar1) {
    (*(this->super_error_domain)._vptr_error_domain[1])(&local_30,this,lStack_18);
    pcVar2 = string_ref::c_str(&local_30);
    nodecpp::log::default_log::log<char_const*,char_const*>(local_1c,"{} happened at",pcVar2);
    string_ref::~string_ref(&local_30);
    dVar3 = StackInfo::log((StackInfo *)(lStack_18 + 8),__x_00);
  }
  else {
    (*(this->super_error_domain)._vptr_error_domain[1])(local_50,this,lStack_18);
    pcVar2 = string_ref::c_str(local_50);
    nodecpp::log::default_log::log<char_const*,char_const*>(local_1c,"{}",pcVar2);
    string_ref::~string_ref(local_50);
    dVar3 = extraout_XMM0_Qa;
  }
  return dVar3;
}

Assistant:

virtual void log(error_value* value, log::LogLevel l ) const { 
			if ( ::nodecpp::impl::isDataStackInfo( value->stackInfo ) )
			{
				log::default_log::log( l, "{} happened at", value_to_message( value ).c_str() );
				value->stackInfo.log( l );
			}
			else
				log::default_log::log( l, "{}", value_to_message( value ).c_str() );
		}